

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O0

double Js::Math::Atan2(double x,double y)

{
  double dVar1;
  double result;
  double y_local;
  double x_local;
  
  dVar1 = atan2(x,y);
  return dVar1;
}

Assistant:

double Math::Atan2( double x, double y )
    {
        double result;
#if defined(_M_IX86) && defined(_WIN32)
        // This is for perf, not for functionality
        // If non Win32 CRT implementation already support SSE2,
        // then we get most of the perf already.
        if (AutoSystemInfo::Data.SSE2Available())
        {
            _asm
            {
                movsd xmm0, x
                movsd xmm1, y
                call dword ptr[__libm_sse2_atan2]
                movsd result, xmm0
            }
        }
        else
#endif
        {
            result = ::atan2(x, y);
        }
        return result;
    }